

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O1

err_t dstuPointRecover(octet *point,dstu_params *params,octet *xpoint)

{
  word *stack;
  ec_o *blob;
  err_t eVar1;
  bool_t bVar2;
  uint uVar3;
  bool_t bVar4;
  size_t sVar5;
  qr_o *pqVar6;
  word *b;
  word *a;
  ec_o *ec;
  ec_o *local_38;
  
  local_38 = (ec_o *)0x0;
  eVar1 = dstuEcCreate(&local_38,params,dstuPointRecover_deep);
  blob = local_38;
  if (eVar1 != 0) {
    return eVar1;
  }
  bVar2 = memIsValid(xpoint,local_38->f->no);
  if ((bVar2 != 0) && (bVar2 = memIsValid(point,blob->f->no * 2), bVar2 != 0)) {
    a = (word *)((long)&(blob->hdr).keep + (blob->hdr).keep);
    pqVar6 = blob->f;
    b = a + pqVar6->n;
    stack = b + pqVar6->n;
    bVar2 = (*pqVar6->from)(a,xpoint,pqVar6,stack);
    if (bVar2 == 0) {
      blobClose(blob);
      return 0x191;
    }
    bVar2 = wwIsZero(a,blob->f->n);
    if (bVar2 == 0) {
      bVar2 = wwTestBit(a,0);
      wwSetBit(a,0,0);
      uVar3 = gf2Tr(a,blob->f,stack);
      if (uVar3 != params->A) {
        wwSetBit(a,0,1);
      }
      (*blob->f->sqr)(b,a,blob->f,stack);
      (*blob->f->div)(b,blob->B,b,blob->f,stack);
      wwXor2(b,a,blob->f->n);
      if (params->A != '\0') {
        wwFlipBit(b,0);
      }
      bVar4 = gf2QSolve(b,blob->f->unity,b,blob->f,stack);
      if (bVar4 == 0) {
        blobClose(blob);
        return 0x1f6;
      }
      bVar4 = gf2Tr(b,blob->f,stack);
      (*blob->f->mul)(b,a,b,blob->f,stack);
      if (bVar4 != bVar2) {
        wwXor2(b,a,blob->f->n);
      }
      (*blob->f->to)(point,a,blob->f,stack);
      pqVar6 = blob->f;
      sVar5 = pqVar6->no;
    }
    else {
      sVar5 = gf2Deg(blob->f);
      while (sVar5 = sVar5 - 1, sVar5 != 0) {
        (*blob->f->sqr)(blob->B,blob->B,blob->f,stack);
      }
      pqVar6 = blob->f;
      b = blob->B;
      sVar5 = pqVar6->n;
    }
    (*pqVar6->to)(point + sVar5,b,pqVar6,stack);
    blobClose(blob);
    return 0;
  }
  blobClose(blob);
  return 0x6d;
}

Assistant:

err_t dstuPointRecover(octet point[], const dstu_params* params, 
	const octet xpoint[])
{
	err_t code;
	register bool_t trace;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointRecover_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(xpoint, ec->f->no) || 
		!memIsValid(point, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// загрузить сжатое представление точки
	if (!qrFrom(x, xpoint, ec->f, stack))
	{
		dstuEcClose(ec);
		return ERR_BAD_POINT;
	}
	// x == 0?
	if (qrIsZero(x, ec->f))
	{
		size_t m = gf2Deg(ec->f);
		// b <- b^{2^{m - 1}}
		while (--m)
			qrSqr(ec->B, ec->B, ec->f, stack);
		// выгрузить y-координату
		qrTo(point + ec->f->n, ec->B, ec->f, stack);
		// все нормально
		dstuEcClose(ec);
		return ERR_OK;
	}
	// восстановить первый разряд x
	trace = wwTestBit(x, 0);
	wwSetBit(x, 0, 0);
	if (gf2Tr(x, ec->f, stack) != (bool_t)params->A)
		wwSetBit(x, 0, 1);
	// y <- x + a + b / x^2
	qrSqr(y, x, ec->f, stack);
	qrDiv(y, ec->B, y, ec->f, stack);
	gf2Add2(y, x, ec->f);
	if (params->A)
		wwFlipBit(y, 0);
	// Solve[z^2 + z == y]
	if (!gf2QSolve(y, ec->f->unity, y, ec->f, stack))
	{
		trace = 0;
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// tr(y) == trace?
	if (gf2Tr(y, ec->f, stack) == trace)
		// y <- y * x
		qrMul(y, x, y, ec->f, stack);
	else
		// y <- (y + 1) * x
		qrMul(y, x, y, ec->f, stack),
		gf2Add2(y, x, ec->f);
	// выгрузить точку
	qrTo(point, x, ec->f, stack);
	qrTo(point + ec->f->no, y, ec->f, stack);
	// все нормально
	trace = 0;
	dstuEcClose(ec);
	return code;
}